

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall
rengine::OpenGLRenderer::drawTextureQuad
          (OpenGLRenderer *this,uint offset,GLuint texId,float opacity,Format format)

{
  int iVar1;
  Program *pPVar2;
  int iVar3;
  int iVar4;
  
  if ((opacity != 1.0) || (NAN(opacity))) {
    pPVar2 = this->m_activeShader;
    if ((anon_struct_16_2_ef16f3e9_for_prog_alphaTexture *)pPVar2 != &this->prog_alphaTexture) {
      if (pPVar2 == (Program *)0x0) {
        iVar3 = 0;
      }
      else {
        iVar3 = (pPVar2->super_OpenGLShaderProgram).m_attributeCount;
      }
      iVar1 = (this->prog_alphaTexture).super_Program.super_OpenGLShaderProgram.m_attributeCount;
      glUseProgram((this->prog_alphaTexture).super_Program.super_OpenGLShaderProgram.m_id);
      iVar4 = iVar3;
      if (iVar3 < iVar1) {
        do {
          glEnableVertexAttribArray(iVar4);
          iVar4 = iVar4 + 1;
        } while (iVar1 != iVar4);
      }
      while (iVar1 < iVar3) {
        iVar3 = iVar3 + -1;
        glDisableVertexAttribArray(iVar3);
      }
      this->m_activeShader = &(this->prog_alphaTexture).super_Program;
    }
    if ((this->m_matrixState & 8) != 0) {
      this->m_matrixState = this->m_matrixState & 0xfffffff7;
      glUniformMatrix4fv(opacity,(this->prog_alphaTexture).super_Program.matrix,1,1,&this->m_proj);
    }
    glUniform1f(opacity,(this->prog_alphaTexture).alpha);
  }
  else {
    if ((format == BGRA_32) || (format == BGRx_32)) {
      pPVar2 = this->m_activeShader;
      if (pPVar2 != &this->prog_texture_bgr) {
        if (pPVar2 == (Program *)0x0) {
          iVar3 = 0;
        }
        else {
          iVar3 = (pPVar2->super_OpenGLShaderProgram).m_attributeCount;
        }
        iVar1 = (this->prog_texture_bgr).super_OpenGLShaderProgram.m_attributeCount;
        glUseProgram((this->prog_texture_bgr).super_OpenGLShaderProgram.m_id);
        iVar4 = iVar3;
        if (iVar3 < iVar1) {
          do {
            glEnableVertexAttribArray(iVar4);
            iVar4 = iVar4 + 1;
          } while (iVar1 != iVar4);
        }
        while (iVar1 < iVar3) {
          iVar3 = iVar3 + -1;
          glDisableVertexAttribArray(iVar3);
        }
        this->m_activeShader = &this->prog_texture_bgr;
      }
      if ((this->m_matrixState & 4) == 0) goto LAB_00126419;
      this->m_matrixState = this->m_matrixState & 0xfffffffb;
      iVar3 = (this->prog_texture_bgr).matrix;
    }
    else {
      pPVar2 = this->m_activeShader;
      if (pPVar2 != &this->prog_texture) {
        if (pPVar2 == (Program *)0x0) {
          iVar3 = 0;
        }
        else {
          iVar3 = (pPVar2->super_OpenGLShaderProgram).m_attributeCount;
        }
        iVar1 = (this->prog_texture).super_OpenGLShaderProgram.m_attributeCount;
        glUseProgram((this->prog_texture).super_OpenGLShaderProgram.m_id);
        iVar4 = iVar3;
        if (iVar3 < iVar1) {
          do {
            glEnableVertexAttribArray(iVar4);
            iVar4 = iVar4 + 1;
          } while (iVar1 != iVar4);
        }
        while (iVar1 < iVar3) {
          iVar3 = iVar3 + -1;
          glDisableVertexAttribArray(iVar3);
        }
        this->m_activeShader = &this->prog_texture;
      }
      if ((this->m_matrixState & 2) == 0) goto LAB_00126419;
      this->m_matrixState = this->m_matrixState & 0xfffffffd;
      iVar3 = (this->prog_texture).matrix;
    }
    glUniformMatrix4fv(iVar3,1,1,&this->m_proj);
  }
LAB_00126419:
  glVertexAttribPointer(0,2,0x1406,0,0,(ulong)offset << 3);
  glBindTexture(0xde1,texId);
  glDrawArrays(5,0,4);
  return;
}

Assistant:

inline void OpenGLRenderer::drawTextureQuad(unsigned offset, GLuint texId, float opacity, Texture::Format format)
{
    if (opacity == 1) {
        if (format == Texture::BGRA_32 || format == Texture::BGRx_32) {
            activateShader(&prog_texture_bgr);
            ensureMatrixUpdated(UpdateTextureBgrProgram, &prog_texture_bgr);
        } else {
            activateShader(&prog_texture);
            ensureMatrixUpdated(UpdateTextureProgram, &prog_texture);
        }
    } else {
        activateShader(&prog_alphaTexture);
        ensureMatrixUpdated(UpdateAlphaTextureProgram, &prog_alphaTexture);
        glUniform1f(prog_alphaTexture.alpha, opacity);
    }

    glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, (void *) (offset * sizeof(vec2)));
    glBindTexture(GL_TEXTURE_2D, texId);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
}